

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.h
# Opt level: O2

void sse::common::zero<int>(int *pDst,int len)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  
  piVar1 = pDst;
  for (iVar2 = len >> 2; 3 < iVar2; iVar2 = iVar2 + -4) {
    piVar1[0xc] = 0;
    piVar1[0xd] = 0;
    piVar1[0xe] = 0;
    piVar1[0xf] = 0;
    piVar1[8] = 0;
    piVar1[9] = 0;
    piVar1[10] = 0;
    piVar1[0xb] = 0;
    piVar1[4] = 0;
    piVar1[5] = 0;
    piVar1[6] = 0;
    piVar1[7] = 0;
    piVar1[0] = 0;
    piVar1[1] = 0;
    piVar1[2] = 0;
    piVar1[3] = 0;
    piVar1 = piVar1 + 0x10;
  }
  if (1 < iVar2) {
    iVar2 = iVar2 + -2;
    piVar1[4] = 0;
    piVar1[5] = 0;
    piVar1[6] = 0;
    piVar1[7] = 0;
    piVar1[0] = 0;
    piVar1[1] = 0;
    piVar1[2] = 0;
    piVar1[3] = 0;
    piVar1 = piVar1 + 8;
  }
  if (iVar2 != 0) {
    piVar1[0] = 0;
    piVar1[1] = 0;
    piVar1[2] = 0;
    piVar1[3] = 0;
  }
  for (lVar3 = (long)(int)(len & 0xfffffffc); lVar3 < len; lVar3 = lVar3 + 1) {
    pDst[lVar3] = 0;
  }
  return;
}

Assistant:

_SIMD_SSE_T void zero(_T* pDst, int len)
        {
            set<_T>((_T)0, pDst, len);
        }